

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraintSolver.cpp
# Opt level: O2

void __thiscall
btMultiBodyConstraintSolver::convertMultiBodyContact
          (btMultiBodyConstraintSolver *this,btPersistentManifold *manifold,
          btContactSolverInfo *infoGlobal)

{
  btVector3 *p;
  btManifoldPoint *pbVar1;
  int frictionIndex;
  btCollisionObject *body;
  btCollisionObject *body_00;
  uint uVar2;
  btMultiBodySolverConstraint *solverConstraint;
  btCollisionObject *pbVar3;
  btVector3 *q;
  btCollisionObject *pbVar4;
  long lVar5;
  btScalar desiredVelocity;
  btScalar in_XMM1_Da;
  btScalar in_XMM2_Da;
  int local_84;
  int local_80;
  btScalar relaxation;
  btMultiBody *local_78;
  btMultiBody *local_70;
  long local_68;
  btScalar local_5c;
  btPersistentManifold *local_58;
  btCollisionObject *local_50;
  btCollisionObject *local_48;
  btAlignedObjectArray<btMultiBodySolverConstraint> *local_40;
  btManifoldPoint *local_38;
  
  body = manifold->m_body0;
  body_00 = manifold->m_body1;
  pbVar3 = body;
  if ((body->m_internalType & 0x40) == 0) {
    pbVar3 = (btCollisionObject *)0x0;
  }
  local_70 = (btMultiBody *)0x0;
  pbVar4 = body_00;
  if ((body_00->m_internalType & 0x40) == 0) {
    pbVar4 = (btCollisionObject *)0x0;
  }
  if (pbVar3 != (btCollisionObject *)0x0) {
    local_70 = (btMultiBody *)pbVar3[1]._vptr_btCollisionObject;
  }
  if (pbVar4 == (btCollisionObject *)0x0) {
    local_78 = (btMultiBody *)0x0;
  }
  else {
    local_78 = (btMultiBody *)pbVar4[1]._vptr_btCollisionObject;
  }
  local_80 = -1;
  local_84 = local_80;
  if (local_70 == (btMultiBody *)0x0) {
    local_84 = btSequentialImpulseConstraintSolver::getOrInitSolverBody
                         (&this->super_btSequentialImpulseConstraintSolver,body,
                          (infoGlobal->super_btContactSolverInfoData).m_timeStep);
  }
  local_50 = pbVar4;
  local_48 = pbVar3;
  if (local_78 == (btMultiBody *)0x0) {
    local_80 = btSequentialImpulseConstraintSolver::getOrInitSolverBody
                         (&this->super_btSequentialImpulseConstraintSolver,body_00,
                          (infoGlobal->super_btContactSolverInfoData).m_timeStep);
  }
  local_40 = &this->m_multiBodyNormalContactConstraints;
  q = &manifold->m_pointCache[0].m_lateralFrictionDir2;
  local_58 = manifold;
  for (lVar5 = 0; lVar5 < manifold->m_cachedPoints; lVar5 = lVar5 + 1) {
    if (*(btScalar *)((long)(q + -6) + 4) <= manifold->m_contactProcessingThreshold) {
      frictionIndex = *(int *)&this->field_0x16c;
      solverConstraint =
           btAlignedObjectArray<btMultiBodySolverConstraint>::expandNonInitializing(local_40);
      solverConstraint->m_orgConstraint = (btMultiBodyConstraint *)0x0;
      solverConstraint->m_orgDofIndex = -1;
      solverConstraint->m_solverBodyIdA = local_84;
      solverConstraint->m_solverBodyIdB = local_80;
      solverConstraint->m_multiBodyA = local_70;
      if (local_70 != (btMultiBody *)0x0) {
        solverConstraint->m_linkA = (int)local_48[1].m_worldTransform.m_basis.m_el[0].m_floats[0];
      }
      solverConstraint->m_multiBodyB = local_78;
      if (local_78 != (btMultiBody *)0x0) {
        solverConstraint->m_linkB = (int)local_50[1].m_worldTransform.m_basis.m_el[0].m_floats[0];
      }
      pbVar1 = (btManifoldPoint *)(q[-0xb].m_floats + 1);
      (solverConstraint->field_19).m_originalContactPoint = pbVar1;
      setupMultiBodyContactConstraint
                (this,solverConstraint,(btVector3 *)((long)(q + -7) + 4),pbVar1,infoGlobal,
                 &relaxation,false,desiredVelocity,in_XMM1_Da);
      manifold = local_58;
      solverConstraint->m_frictionIndex = frictionIndex;
      if ((((infoGlobal->super_btContactSolverInfoData).m_solverMode & 0x20) == 0) ||
         (*(char *)((long)(q + -4) + 0xc) == '\0')) {
        p = q + -1;
        local_68 = lVar5;
        local_38 = pbVar1;
        btPlaneSpace1<btVector3>((btVector3 *)((long)(q + -7) + 4),p,q);
        btSequentialImpulseConstraintSolver::applyAnisotropicFriction(body,p,1);
        btSequentialImpulseConstraintSolver::applyAnisotropicFriction(body_00,p,1);
        pbVar1 = local_38;
        manifold = local_58;
        local_5c = relaxation;
        addMultiBodyFrictionConstraint
                  (this,p,local_58,frictionIndex,local_38,body,body_00,relaxation,infoGlobal,
                   in_XMM1_Da,in_XMM2_Da);
        uVar2 = (infoGlobal->super_btContactSolverInfoData).m_solverMode;
        if ((uVar2 & 0x10) != 0) {
          btSequentialImpulseConstraintSolver::applyAnisotropicFriction(body,q,1);
          btSequentialImpulseConstraintSolver::applyAnisotropicFriction(body_00,q,1);
          addMultiBodyFrictionConstraint
                    (this,q,manifold,frictionIndex,pbVar1,body,body_00,local_5c,infoGlobal,
                     in_XMM1_Da,in_XMM2_Da);
          uVar2 = (infoGlobal->super_btContactSolverInfoData).m_solverMode;
        }
        lVar5 = local_68;
        if ((~uVar2 & 0x50) == 0) {
          *(undefined1 *)((long)(q + -4) + 0xc) = 1;
        }
      }
      else {
        local_68 = CONCAT44(local_68._4_4_,relaxation);
        addMultiBodyFrictionConstraint
                  (this,q + -1,local_58,frictionIndex,pbVar1,body,body_00,relaxation,infoGlobal,
                   in_XMM1_Da,in_XMM2_Da);
        if (((infoGlobal->super_btContactSolverInfoData).m_solverMode & 0x10) != 0) {
          addMultiBodyFrictionConstraint
                    (this,q,manifold,frictionIndex,pbVar1,body,body_00,(btScalar)local_68,infoGlobal
                     ,in_XMM1_Da,in_XMM2_Da);
        }
        solverConstraint->m_appliedPushImpulse = 0.0;
        solverConstraint->m_appliedImpulse = 0.0;
      }
    }
    q = q + 0xc;
  }
  return;
}

Assistant:

void	btMultiBodyConstraintSolver::convertMultiBodyContact(btPersistentManifold* manifold,const btContactSolverInfo& infoGlobal)
{
	const btMultiBodyLinkCollider* fcA = btMultiBodyLinkCollider::upcast(manifold->getBody0());
	const btMultiBodyLinkCollider* fcB = btMultiBodyLinkCollider::upcast(manifold->getBody1());
	
	btMultiBody* mbA = fcA? fcA->m_multiBody : 0;
	btMultiBody* mbB = fcB? fcB->m_multiBody : 0;

	btCollisionObject* colObj0=0,*colObj1=0;

	colObj0 = (btCollisionObject*)manifold->getBody0();
	colObj1 = (btCollisionObject*)manifold->getBody1();

	int solverBodyIdA = mbA? -1 : getOrInitSolverBody(*colObj0,infoGlobal.m_timeStep);
	int solverBodyIdB = mbB ? -1 : getOrInitSolverBody(*colObj1,infoGlobal.m_timeStep);

//	btSolverBody* solverBodyA = mbA ? 0 : &m_tmpSolverBodyPool[solverBodyIdA];
//	btSolverBody* solverBodyB = mbB ? 0 : &m_tmpSolverBodyPool[solverBodyIdB];


	///avoid collision response between two static objects
//	if (!solverBodyA || (solverBodyA->m_invMass.isZero() && (!solverBodyB || solverBodyB->m_invMass.isZero())))
	//	return;



	for (int j=0;j<manifold->getNumContacts();j++)
	{

		btManifoldPoint& cp = manifold->getContactPoint(j);

		if (cp.getDistance() <= manifold->getContactProcessingThreshold())
		{
		
			btScalar relaxation;

			int frictionIndex = m_multiBodyNormalContactConstraints.size();

			btMultiBodySolverConstraint& solverConstraint = m_multiBodyNormalContactConstraints.expandNonInitializing();

	//		btRigidBody* rb0 = btRigidBody::upcast(colObj0);
	//		btRigidBody* rb1 = btRigidBody::upcast(colObj1);
            solverConstraint.m_orgConstraint = 0;
            solverConstraint.m_orgDofIndex = -1;
			solverConstraint.m_solverBodyIdA = solverBodyIdA;
			solverConstraint.m_solverBodyIdB = solverBodyIdB;
			solverConstraint.m_multiBodyA = mbA;
			if (mbA)
				solverConstraint.m_linkA = fcA->m_link;

			solverConstraint.m_multiBodyB = mbB;
			if (mbB)
				solverConstraint.m_linkB = fcB->m_link;

			solverConstraint.m_originalContactPoint = &cp;

			bool isFriction = false;
			setupMultiBodyContactConstraint(solverConstraint, cp.m_normalWorldOnB,cp, infoGlobal, relaxation, isFriction);

//			const btVector3& pos1 = cp.getPositionWorldOnA();
//			const btVector3& pos2 = cp.getPositionWorldOnB();

			/////setup the friction constraints
#define ENABLE_FRICTION
#ifdef ENABLE_FRICTION
			solverConstraint.m_frictionIndex = frictionIndex;
#if ROLLING_FRICTION
	int rollingFriction=1;
			btVector3 angVelA(0,0,0),angVelB(0,0,0);
			if (rb0)
				angVelA = rb0->getAngularVelocity();
			if (rb1)
				angVelB = rb1->getAngularVelocity();
			btVector3 relAngVel = angVelB-angVelA;

			if ((cp.m_combinedRollingFriction>0.f) && (rollingFriction>0))
			{
				//only a single rollingFriction per manifold
				rollingFriction--;
				if (relAngVel.length()>infoGlobal.m_singleAxisRollingFrictionThreshold)
				{
					relAngVel.normalize();
					applyAnisotropicFriction(colObj0,relAngVel,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,relAngVel,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					if (relAngVel.length()>0.001)
						addRollingFrictionConstraint(relAngVel,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

				} else
				{
					addRollingFrictionConstraint(cp.m_normalWorldOnB,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
					btVector3 axis0,axis1;
					btPlaneSpace1(cp.m_normalWorldOnB,axis0,axis1);
					applyAnisotropicFriction(colObj0,axis0,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,axis0,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj0,axis1,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,axis1,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					if (axis0.length()>0.001)
						addRollingFrictionConstraint(axis0,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
					if (axis1.length()>0.001)
						addRollingFrictionConstraint(axis1,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
		
				}
			}
#endif //ROLLING_FRICTION

			///Bullet has several options to set the friction directions
			///By default, each contact has only a single friction direction that is recomputed automatically very frame 
			///based on the relative linear velocity.
			///If the relative velocity it zero, it will automatically compute a friction direction.
			
			///You can also enable two friction directions, using the SOLVER_USE_2_FRICTION_DIRECTIONS.
			///In that case, the second friction direction will be orthogonal to both contact normal and first friction direction.
			///
			///If you choose SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION, then the friction will be independent from the relative projected velocity.
			///
			///The user can manually override the friction directions for certain contacts using a contact callback, 
			///and set the cp.m_lateralFrictionInitialized to true
			///In that case, you can set the target relative motion in each friction direction (cp.m_contactMotion1 and cp.m_contactMotion2)
			///this will give a conveyor belt effect
			///
			if (!(infoGlobal.m_solverMode & SOLVER_ENABLE_FRICTION_DIRECTION_CACHING) || !cp.m_lateralFrictionInitialized)
			{/*
				cp.m_lateralFrictionDir1 = vel - cp.m_normalWorldOnB * rel_vel;
				btScalar lat_rel_vel = cp.m_lateralFrictionDir1.length2();
				if (!(infoGlobal.m_solverMode & SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION) && lat_rel_vel > SIMD_EPSILON)
				{
					cp.m_lateralFrictionDir1 *= 1.f/btSqrt(lat_rel_vel);
					if((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					{
						cp.m_lateralFrictionDir2 = cp.m_lateralFrictionDir1.cross(cp.m_normalWorldOnB);
						cp.m_lateralFrictionDir2.normalize();//??
						applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

					}

					applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

				} else
				*/
				{
					btPlaneSpace1(cp.m_normalWorldOnB,cp.m_lateralFrictionDir1,cp.m_lateralFrictionDir2);

					applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal);

					if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					{
						applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal);
					}

					if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS) && (infoGlobal.m_solverMode & SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION))
					{
						cp.m_lateralFrictionInitialized = true;
					}
				}

			} else
			{
				addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal,cp.m_contactMotion1, cp.m_contactCFM1);

				if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,manifold,frictionIndex,cp,colObj0,colObj1, relaxation, infoGlobal,cp.m_contactMotion2, cp.m_contactCFM2);

				//setMultiBodyFrictionConstraintImpulse( solverConstraint, solverBodyIdA, solverBodyIdB, cp, infoGlobal);
				//todo:
				solverConstraint.m_appliedImpulse = 0.f;
				solverConstraint.m_appliedPushImpulse = 0.f;
			}
		

#endif //ENABLE_FRICTION

		}
	}
}